

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O2

void dlep_extension_add_processing
               (dlep_extension *ext,_Bool radio,dlep_extension_implementation *processing,
               size_t proc_count)

{
  dlep_extension_signal *pdVar1;
  size_t j;
  size_t sVar2;
  dlep_extension_implementation *pdVar3;
  long lVar4;
  size_t sVar5;
  bool bVar6;
  
  sVar2 = 0;
  do {
    if (sVar2 == proc_count) {
      return;
    }
    sVar5 = ext->signal_count;
    pdVar3 = processing + sVar2;
    lVar4 = 0;
    while (bVar6 = sVar5 != 0, sVar5 = sVar5 - 1, bVar6) {
      pdVar1 = ext->signals;
      if (*(int *)((long)&pdVar1->id + lVar4) == pdVar3->id) {
        if (radio) {
          *(_func_dlep_parser_error_dlep_extension_ptr_dlep_session_ptr **)
           ((long)&pdVar1->process_radio + lVar4) = pdVar3->process;
          *(_func_int_dlep_extension_ptr_dlep_session_ptr_oonf_layer2_neigh_key_ptr **)
           ((long)&ext->signals->add_radio_tlvs + lVar4) = pdVar3->add_tlvs;
        }
        else {
          *(_func_dlep_parser_error_dlep_extension_ptr_dlep_session_ptr **)
           ((long)&pdVar1->process_router + lVar4) = pdVar3->process;
          *(_func_int_dlep_extension_ptr_dlep_session_ptr_oonf_layer2_neigh_key_ptr **)
           ((long)&ext->signals->add_router_tlvs + lVar4) = pdVar3->add_tlvs;
        }
        break;
      }
      lVar4 = lVar4 + 0x58;
    }
    sVar2 = sVar2 + 1;
  } while( true );
}

Assistant:

void
dlep_extension_add_processing(
  struct dlep_extension *ext, bool radio, struct dlep_extension_implementation *processing, size_t proc_count) {
  size_t i, j;

  for (j = 0; j < proc_count; j++) {
    for (i = 0; i < ext->signal_count; i++) {
      if (ext->signals[i].id == processing[j].id) {
        if (radio) {
          ext->signals[i].process_radio = processing[j].process;
          ext->signals[i].add_radio_tlvs = processing[j].add_tlvs;
        }
        else {
          ext->signals[i].process_router = processing[j].process;
          ext->signals[i].add_router_tlvs = processing[j].add_tlvs;
        }
        break;
      }
    }
  }
}